

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg_err.c
# Opt level: O0

int ERR_load_AFALG_strings(void)

{
  if (lib_code == 0) {
    lib_code = ERR_get_next_error_library();
  }
  if (error_loaded == 0) {
    ERR_load_strings(lib_code,(ERR_STRING_DATA *)AFALG_str_reasons);
    error_loaded = 1;
  }
  return 1;
}

Assistant:

static int ERR_load_AFALG_strings(void)
{
    if (lib_code == 0)
        lib_code = ERR_get_next_error_library();

    if (!error_loaded) {
#ifndef OPENSSL_NO_ERR
        ERR_load_strings(lib_code, AFALG_str_reasons);
#endif
        error_loaded = 1;
    }
    return 1;
}